

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

void embree::avx512::InstanceArrayIntersectorK<8>::intersect
               (vbool<8>_conflict *valid_i,Precalculations *pre,RayHitK<8> *ray,
               RayQueryContext *context,Primitive_conflict4 *prim)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint uVar5;
  Geometry *pGVar6;
  RTCRayQueryContext *pRVar7;
  long *plVar8;
  long lVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined8 uVar13;
  undefined1 auVar14 [16];
  ulong uVar15;
  _func_int *p_Var16;
  byte bVar17;
  long lVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  vfloat4 a0_2;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined4 uVar37;
  vfloat4 a0;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 in_ZMM2 [64];
  int iVar46;
  vfloat4 a0_1;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_ZMM4 [64];
  vfloat4 b0;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  float fVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  float fVar63;
  float fVar68;
  float fVar69;
  vfloat4 a1;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar70;
  undefined1 auVar67 [32];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  RayQueryContext newcontext;
  vint<8> mask;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined1 local_40 [32];
  
  auVar24 = in_ZMM4._0_16_;
  a0.field_0 = in_ZMM1._0_16_;
  a0_1.field_0 = in_ZMM3._0_16_;
  auVar23 = in_ZMM2._0_16_;
  uVar5 = prim->primID_;
  pGVar6 = (context->scene->geometries).items[prim->instID_].ptr;
  p_Var16 = *(_func_int **)&pGVar6->field_0x58;
  if (p_Var16 == (_func_int *)0x0) {
    uVar15 = (ulong)*(uint *)(*(long *)&pGVar6[1].time_range.upper +
                             (long)pGVar6[1].intersectionFilterN * (ulong)uVar5);
    if (uVar15 == 0xffffffff) {
      p_Var16 = (_func_int *)0x0;
    }
    else {
      p_Var16 = pGVar6[1].super_RefCount._vptr_RefCount[uVar15];
    }
  }
  if (p_Var16 != (_func_int *)0x0) {
    uVar1 = pGVar6->mask;
    auVar19._4_4_ = uVar1;
    auVar19._0_4_ = uVar1;
    auVar19._8_4_ = uVar1;
    auVar19._12_4_ = uVar1;
    auVar36._16_4_ = uVar1;
    auVar36._0_16_ = auVar19;
    auVar36._20_4_ = uVar1;
    auVar36._24_4_ = uVar1;
    auVar36._28_4_ = uVar1;
    uVar13 = vptestmd_avx512vl(auVar36,*(undefined1 (*) [32])(ray + 0x120));
    bVar17 = (byte)uVar13 & valid_i->v;
    if ((bVar17 != 0) && (pRVar7 = context->user, pRVar7->instID[0] == 0xffffffff)) {
      pRVar7->instID[0] = prim->instID_;
      pRVar7->instPrimID[0] = uVar5;
      uVar15 = (ulong)prim->primID_;
      plVar8 = *(long **)&pGVar6[1].fnumTimeSegments;
      iVar46 = (int)plVar8[4];
      if ((pGVar6->field_8).field_0x1 == '\x01') {
        if (iVar46 == 0x9134) {
          lVar9 = *plVar8;
          lVar18 = uVar15 * plVar8[2];
          auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + lVar18)),
                                  ZEXT416(*(uint *)(lVar9 + 0x10 + lVar18)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar9 + 0x20 + lVar18)),0x28);
          auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 4 + lVar18)),
                                  ZEXT416(*(uint *)(lVar9 + 0x14 + lVar18)),0x1c);
          auVar24 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar9 + 0x24 + lVar18)),0x28);
          auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 8 + lVar18)),
                                  ZEXT416(*(uint *)(lVar9 + 0x18 + lVar18)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar9 + 0x28 + lVar18)),0x28);
          auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 0xc + lVar18)),
                                  ZEXT416(*(uint *)(lVar9 + 0x1c + lVar18)),0x1c);
          auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar9 + 0x2c + lVar18)),0x28);
        }
        else if (iVar46 == 0x9234) {
          lVar9 = *plVar8;
          lVar18 = uVar15 * plVar8[2];
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *(ulong *)(lVar9 + 4 + lVar18);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar18);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + lVar18)),_DAT_02060e80,auVar24);
          auVar24 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0xc + lVar18)),_DAT_02060e80,
                                       auVar44);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = *(ulong *)(lVar9 + 0x1c + lVar18);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0x18 + lVar18)),_DAT_02060e80,
                                            auVar20);
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *(ulong *)(lVar9 + 0x28 + lVar18);
          auVar23 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0x24 + lVar18)),_DAT_02060e80,
                                       auVar21);
        }
        else if (iVar46 == 0xb001) {
          lVar9 = *plVar8;
          lVar18 = uVar15 * plVar8[2];
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar18);
          auVar24 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(lVar9 + 8 + lVar18)),0x20);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = *(ulong *)(lVar9 + 0x34 + lVar18);
          auVar19 = vpermt2ps_avx512vl(auVar40,_DAT_02060e90,ZEXT416(*(uint *)(lVar9 + lVar18)));
          auVar22._8_8_ = 0;
          auVar22._0_8_ = *(ulong *)(lVar9 + 0x1c + lVar18);
          fVar63 = *(float *)(lVar9 + 0x24 + lVar18);
          fVar68 = *(float *)(lVar9 + 0x28 + lVar18);
          fVar69 = *(float *)(lVar9 + 0x2c + lVar18);
          auVar20 = vpermt2ps_avx512vl(auVar22,_DAT_02060e90,
                                       ZEXT416(*(uint *)(lVar9 + 0x18 + lVar18)));
          fVar70 = *(float *)(lVar9 + 0x30 + lVar18);
          auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * fVar68)),ZEXT416((uint)fVar63),
                                    ZEXT416((uint)fVar63));
          auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
          auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar70),ZEXT416((uint)fVar70));
          auVar21 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar23._0_4_));
          fVar55 = auVar21._0_4_;
          fVar55 = fVar55 * 1.5 + fVar55 * fVar55 * fVar55 * auVar23._0_4_ * -0.5;
          auVar23 = vinsertps_avx(auVar20,ZEXT416((uint)(fVar55 * fVar63)),0x30);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar19,ZEXT416((uint)(fVar55 * fVar68)),0x30);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar24,ZEXT416((uint)(fVar55 * fVar70)),0x30);
          auVar24 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 0xc + lVar18)),
                                  ZEXT416(*(uint *)(lVar9 + 4 + lVar18)),0x10);
          auVar24 = vinsertps_avx(auVar24,ZEXT416(*(uint *)(lVar9 + 0x3c + lVar18)),0x20);
          auVar24 = vinsertps_avx(auVar24,ZEXT416((uint)(fVar69 * fVar55)),0x30);
        }
        else if (iVar46 == 0x9244) {
          lVar9 = *plVar8;
          lVar18 = uVar15 * plVar8[2];
          a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar9 + lVar18))->v;
          auVar24 = *(undefined1 (*) [16])(lVar9 + 0x10 + lVar18);
          a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                          ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar9 + 0x20 + lVar18))
                          ->v;
          auVar23 = *(undefined1 (*) [16])(lVar9 + 0x30 + lVar18);
        }
        auVar19 = vshufps_avx(auVar23,auVar23,0xff);
        auVar21 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
        auVar44 = vshufps_avx(auVar24,auVar24,0xff);
        auVar27 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
        auVar20 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])0x0,0xe9);
        auVar20 = vblendps_avx(auVar20,auVar24,4);
        fVar59 = auVar21._0_4_;
        auVar40 = vfmadd213ss_fma(auVar19,auVar19,ZEXT416((uint)(fVar59 * fVar59)));
        auVar40 = vfnmadd231ss_fma(auVar40,auVar44,auVar44);
        auVar22 = vfnmadd231ss_fma(auVar40,auVar27,auVar27);
        fVar55 = auVar19._0_4_;
        auVar25 = ZEXT416((uint)(auVar27._0_4_ * fVar55));
        auVar40 = vfmadd213ss_fma(auVar44,auVar21,auVar25);
        fVar63 = auVar40._0_4_ + auVar40._0_4_;
        auVar48 = ZEXT416((uint)(auVar44._0_4_ * fVar55));
        auVar40 = vfmsub213ss_fma(auVar27,auVar21,auVar48);
        fVar68 = auVar40._0_4_ + auVar40._0_4_;
        auVar40 = vfmsub231ss_fma(auVar25,auVar21,auVar44);
        fVar69 = auVar40._0_4_ + auVar40._0_4_;
        auVar40 = vfmsub231ss_fma(ZEXT416((uint)(fVar59 * fVar59)),auVar19,auVar19);
        auVar19 = vfmadd213ss_avx512f(auVar44,auVar44,auVar40);
        auVar25 = vfnmadd231ss_avx512f(auVar19,auVar27,auVar27);
        auVar19 = vfmadd213ss_avx512f(auVar27,auVar44,ZEXT416((uint)(fVar59 * fVar55)));
        auVar26 = vaddss_avx512f(auVar19,auVar19);
        auVar19 = vfmadd213ss_fma(auVar21,auVar27,auVar48);
        fVar70 = auVar19._0_4_ + auVar19._0_4_;
        auVar19 = vfmsub231ss_fma(ZEXT416((uint)(fVar59 * fVar55)),auVar44,auVar27);
        fVar55 = auVar19._0_4_ + auVar19._0_4_;
        auVar19 = vfnmadd231ss_fma(auVar40,auVar44,auVar44);
        auVar21 = vfmadd231ss_fma(auVar19,auVar27,auVar27);
        uVar37 = auVar22._0_4_;
        auVar64._4_4_ = uVar37;
        auVar64._0_4_ = uVar37;
        auVar64._8_4_ = uVar37;
        auVar64._12_4_ = uVar37;
        auVar71._4_4_ = fVar63;
        auVar71._0_4_ = fVar63;
        auVar71._8_4_ = fVar63;
        auVar71._12_4_ = fVar63;
        auVar75._0_4_ = fVar68 * 0.0;
        auVar75._4_4_ = fVar68 * 0.0;
        auVar75._8_4_ = fVar68 * 1.0;
        auVar75._12_4_ = fVar68 * 0.0;
        auVar40 = ZEXT816(0x3f80000000000000);
        auVar19 = vfmadd231ps_fma(auVar75,auVar40,auVar71);
        auVar22 = SUB6416(ZEXT464(0x3f800000),0);
        auVar44 = vfmadd231ps_fma(auVar19,auVar22,auVar64);
        auVar65._4_4_ = fVar69;
        auVar65._0_4_ = fVar69;
        auVar65._8_4_ = fVar69;
        auVar65._12_4_ = fVar69;
        auVar19 = vbroadcastss_avx512vl(auVar25);
        auVar27 = vbroadcastss_avx512vl(auVar26);
        auVar73._0_4_ = auVar27._0_4_ * 0.0;
        auVar73._4_4_ = auVar27._4_4_ * 0.0;
        auVar73._8_4_ = auVar27._8_4_ * 1.0;
        auVar73._12_4_ = auVar27._12_4_ * 0.0;
        auVar19 = vfmadd231ps_fma(auVar73,auVar40,auVar19);
        auVar27 = vfmadd231ps_fma(auVar19,auVar22,auVar65);
        auVar60._4_4_ = fVar70;
        auVar60._0_4_ = fVar70;
        auVar60._8_4_ = fVar70;
        auVar60._12_4_ = fVar70;
        auVar57._4_4_ = fVar55;
        auVar57._0_4_ = fVar55;
        auVar57._8_4_ = fVar55;
        auVar57._12_4_ = fVar55;
        fVar63 = auVar21._0_4_;
        auVar66._0_4_ = fVar63 * 0.0;
        auVar66._4_4_ = fVar63 * 0.0;
        auVar66._8_4_ = fVar63 * 1.0;
        auVar66._12_4_ = fVar63 * 0.0;
        auVar19 = vfmadd231ps_fma(auVar66,auVar40,auVar57);
        auVar19 = vfmadd231ps_fma(auVar19,auVar22,auVar60);
        auVar25._0_4_ = a0.field_0._0_4_;
        auVar25._4_4_ = auVar25._0_4_;
        auVar25._8_4_ = auVar25._0_4_;
        auVar25._12_4_ = auVar25._0_4_;
        fVar63 = auVar19._0_4_;
        auVar58._0_4_ = fVar63 * 0.0;
        fVar68 = auVar19._4_4_;
        auVar58._4_4_ = fVar68 * 0.0;
        fVar69 = auVar19._8_4_;
        auVar58._8_4_ = fVar69 * 0.0;
        fVar70 = auVar19._12_4_;
        auVar58._12_4_ = fVar70 * 0.0;
        auVar19 = vfmadd213ps_fma((undefined1  [16])0x0,auVar27,auVar58);
        auVar19 = vfmadd231ps_fma(auVar19,auVar44,auVar25);
        uVar37 = auVar24._0_4_;
        auVar61._4_4_ = uVar37;
        auVar61._0_4_ = uVar37;
        auVar61._8_4_ = uVar37;
        auVar61._12_4_ = uVar37;
        auVar24 = vshufps_avx(auVar24,auVar24,0x55);
        auVar24 = vfmadd213ps_fma(auVar24,auVar27,auVar58);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vfmadd231ps_fma(auVar24,auVar44,auVar61);
        iVar46 = a0_1.field_0._0_4_;
        auVar50._4_4_ = iVar46;
        auVar50._0_4_ = iVar46;
        auVar50._8_4_ = iVar46;
        auVar50._12_4_ = iVar46;
        auVar24 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0x55);
        auVar21 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xaa);
        auVar48._0_4_ = fVar63 * auVar21._0_4_;
        auVar48._4_4_ = fVar68 * auVar21._4_4_;
        auVar48._8_4_ = fVar69 * auVar21._8_4_;
        auVar48._12_4_ = fVar70 * auVar21._12_4_;
        auVar24 = vfmadd231ps_fma(auVar48,auVar27,auVar24);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vfmadd231ps_fma(auVar24,auVar44,auVar50);
        uVar37 = auVar23._0_4_;
        auVar51._4_4_ = uVar37;
        auVar51._0_4_ = uVar37;
        auVar51._8_4_ = uVar37;
        auVar51._12_4_ = uVar37;
        auVar24 = vshufps_avx(auVar23,auVar23,0x55);
        auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
        auVar26._0_4_ = fVar63 * auVar23._0_4_;
        auVar26._4_4_ = fVar68 * auVar23._4_4_;
        auVar26._8_4_ = fVar69 * auVar23._8_4_;
        auVar26._12_4_ = fVar70 * auVar23._12_4_;
        auVar23 = vfmadd231ps_fma(auVar26,auVar27,auVar24);
        auVar24 = vfmadd231ps_fma(auVar23,auVar44,auVar51);
        auVar23._0_4_ = auVar20._0_4_ + 0.0 + auVar24._0_4_;
        auVar23._4_4_ = auVar20._4_4_ + 0.0 + auVar24._4_4_;
        auVar23._8_4_ = auVar20._8_4_ + 0.0 + auVar24._8_4_;
        auVar23._12_4_ = auVar20._12_4_ + 0.0 + auVar24._12_4_;
      }
      else if (iVar46 == 0x9134) {
        lVar9 = *plVar8;
        lVar18 = uVar15 * plVar8[2];
        auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + lVar18)),
                                ZEXT416(*(uint *)(lVar9 + 0x10 + lVar18)),0x1c);
        auVar19 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar9 + 0x20 + lVar18)),0x28);
        auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 4 + lVar18)),
                                ZEXT416(*(uint *)(lVar9 + 0x14 + lVar18)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar9 + 0x24 + lVar18)),0x28);
        auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 8 + lVar18)),
                                ZEXT416(*(uint *)(lVar9 + 0x18 + lVar18)),0x1c);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar9 + 0x28 + lVar18)),0x28);
        auVar23 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 0xc + lVar18)),
                                ZEXT416(*(uint *)(lVar9 + 0x1c + lVar18)),0x1c);
        auVar23 = vinsertps_avx(auVar23,ZEXT416(*(uint *)(lVar9 + 0x2c + lVar18)),0x28);
      }
      else if (iVar46 == 0x9234) {
        lVar9 = *plVar8;
        lVar18 = uVar15 * plVar8[2];
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)(lVar9 + 4 + lVar18);
        auVar47._8_8_ = 0;
        auVar47._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar18);
        auVar19 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + lVar18)),_DAT_02060e80,auVar41);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0xc + lVar18)),_DAT_02060e80,
                                        auVar47);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)(lVar9 + 0x1c + lVar18);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0x18 + lVar18)),_DAT_02060e80,
                                          auVar42);
        auVar52._8_8_ = 0;
        auVar52._0_8_ = *(ulong *)(lVar9 + 0x28 + lVar18);
        auVar23 = vpermt2ps_avx512vl(ZEXT416(*(uint *)(lVar9 + 0x24 + lVar18)),_DAT_02060e80,auVar52
                                    );
      }
      else if (iVar46 == 0xb001) {
        lVar9 = *plVar8;
        lVar18 = uVar15 * plVar8[2];
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)(lVar9 + 0x10 + lVar18);
        auVar24 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar9 + 8 + lVar18)),0x20);
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)(lVar9 + 0x34 + lVar18);
        auVar19 = vpermt2ps_avx512vl(auVar34,_DAT_02060e90,ZEXT416(*(uint *)(lVar9 + lVar18)));
        auVar53._8_8_ = 0;
        auVar53._0_8_ = *(ulong *)(lVar9 + 0x1c + lVar18);
        fVar63 = *(float *)(lVar9 + 0x24 + lVar18);
        fVar68 = *(float *)(lVar9 + 0x28 + lVar18);
        fVar69 = *(float *)(lVar9 + 0x2c + lVar18);
        auVar20 = vpermt2ps_avx512vl(auVar53,_DAT_02060e90,ZEXT416(*(uint *)(lVar9 + 0x18 + lVar18))
                                    );
        fVar70 = *(float *)(lVar9 + 0x30 + lVar18);
        auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar68 * fVar68)),ZEXT416((uint)fVar63),
                                  ZEXT416((uint)fVar63));
        auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar69),ZEXT416((uint)fVar69));
        auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)fVar70),ZEXT416((uint)fVar70));
        auVar21 = vrsqrt14ss_avx512f(ZEXT816(0),ZEXT416((uint)auVar23._0_4_));
        fVar55 = auVar21._0_4_;
        fVar55 = fVar55 * 1.5 + fVar55 * fVar55 * fVar55 * auVar23._0_4_ * -0.5;
        auVar23 = vinsertps_avx(auVar20,ZEXT416((uint)(fVar55 * fVar63)),0x30);
        auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)(fVar55 * fVar68)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar24,ZEXT416((uint)(fVar55 * fVar70)),0x30);
        auVar24 = vinsertps_avx(ZEXT416(*(uint *)(lVar9 + 0xc + lVar18)),
                                ZEXT416(*(uint *)(lVar9 + 4 + lVar18)),0x10);
        auVar24 = vinsertps_avx(auVar24,ZEXT416(*(uint *)(lVar9 + 0x3c + lVar18)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar24,ZEXT416((uint)(fVar69 * fVar55)),0x30);
      }
      else if (iVar46 == 0x9244) {
        lVar9 = *plVar8;
        lVar18 = uVar15 * plVar8[2];
        auVar19 = *(undefined1 (*) [16])(lVar9 + lVar18);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar9 + 0x10 + lVar18))->v;
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar9 + 0x20 + lVar18))->
                        v;
        auVar23 = *(undefined1 (*) [16])(lVar9 + 0x30 + lVar18);
      }
      auVar24 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xc9);
      auVar20 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
      auVar56._0_4_ = a0_1.field_0._0_4_ * auVar20._0_4_;
      auVar56._4_4_ = a0_1.field_0._4_4_ * auVar20._4_4_;
      auVar56._8_4_ = a0_1.field_0._8_4_ * auVar20._8_4_;
      auVar56._12_4_ = a0_1.field_0._12_4_ * auVar20._12_4_;
      auVar27 = vfmsub231ps_fma(auVar56,(undefined1  [16])a0.field_0,auVar24);
      auVar21 = vshufps_avx(auVar27,auVar27,0xc9);
      auVar44 = vshufps_avx(auVar19,auVar19,0xc9);
      auVar49._0_4_ = auVar19._0_4_ * auVar24._0_4_;
      auVar49._4_4_ = auVar19._4_4_ * auVar24._4_4_;
      auVar49._8_4_ = auVar19._8_4_ * auVar24._8_4_;
      auVar49._12_4_ = auVar19._12_4_ * auVar24._12_4_;
      auVar40 = vfmsub231ps_fma(auVar49,auVar44,(undefined1  [16])a0_1.field_0);
      auVar38._0_4_ = auVar44._0_4_ * a0.field_0._0_4_;
      auVar38._4_4_ = auVar44._4_4_ * a0.field_0._4_4_;
      auVar38._8_4_ = auVar44._8_4_ * a0.field_0._8_4_;
      auVar38._12_4_ = auVar44._12_4_ * a0.field_0._12_4_;
      auVar24 = vfmsub231ps_fma(auVar38,auVar19,auVar20);
      auVar22 = vpermi2ps_avx512vl(_DAT_02064980,auVar21,auVar24);
      auVar20 = vunpcklps_avx(auVar27,auVar24);
      auVar24 = vinsertps_avx(auVar40,auVar40,0x4a);
      auVar44 = vunpcklps_avx(auVar20,ZEXT416(auVar40._0_4_));
      auVar27 = vunpcklps_avx(auVar22,auVar24);
      auVar20 = vunpckhps_avx(auVar22,auVar24);
      auVar24 = vdpps_avx(auVar19,auVar21,0x7f);
      auVar35._0_4_ = auVar24._0_4_;
      auVar35._4_4_ = auVar35._0_4_;
      auVar35._8_4_ = auVar35._0_4_;
      auVar35._12_4_ = auVar35._0_4_;
      auVar24 = vdivps_avx(auVar27,auVar35);
      auVar19 = vdivps_avx(auVar20,auVar35);
      auVar20 = vdivps_avx(auVar44,auVar35);
      uVar37 = auVar23._0_4_;
      auVar39._4_4_ = uVar37;
      auVar39._0_4_ = uVar37;
      auVar39._8_4_ = uVar37;
      auVar39._12_4_ = uVar37;
      auVar21 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      fVar63 = auVar20._0_4_;
      auVar43._0_4_ = auVar23._0_4_ * fVar63;
      auVar43._4_4_ = auVar23._4_4_ * auVar20._4_4_;
      auVar43._8_4_ = auVar23._8_4_ * auVar20._8_4_;
      auVar43._12_4_ = auVar23._12_4_ * auVar20._12_4_;
      auVar23 = vfmadd231ps_fma(auVar43,auVar19,auVar21);
      auVar23 = vfmadd231ps_fma(auVar23,auVar24,auVar39);
      auVar14._8_4_ = 0x80000000;
      auVar14._0_8_ = 0x8000000080000000;
      auVar14._12_4_ = 0x80000000;
      auVar23 = vxorps_avx512vl(auVar23,auVar14);
      auVar45._8_4_ = 1;
      auVar45._0_8_ = 0x100000001;
      auVar45._12_4_ = 1;
      auVar45._16_4_ = 1;
      auVar45._20_4_ = 1;
      auVar45._24_4_ = 1;
      auVar45._28_4_ = 1;
      uVar37 = auVar24._0_4_;
      auVar54._4_4_ = uVar37;
      auVar54._0_4_ = uVar37;
      auVar54._8_4_ = uVar37;
      auVar54._12_4_ = uVar37;
      auVar54._16_4_ = uVar37;
      auVar54._20_4_ = uVar37;
      auVar54._24_4_ = uVar37;
      auVar54._28_4_ = uVar37;
      auVar10 = vpermps_avx2(auVar45,ZEXT1632(auVar24));
      auVar62._8_4_ = 2;
      auVar62._0_8_ = 0x200000002;
      auVar62._12_4_ = 2;
      auVar62._16_4_ = 2;
      auVar62._20_4_ = 2;
      auVar62._24_4_ = 2;
      auVar62._28_4_ = 2;
      auVar11 = vpermps_avx2(auVar62,ZEXT1632(auVar24));
      uVar37 = auVar19._0_4_;
      auVar67._4_4_ = uVar37;
      auVar67._0_4_ = uVar37;
      auVar67._8_4_ = uVar37;
      auVar67._12_4_ = uVar37;
      auVar67._16_4_ = uVar37;
      auVar67._20_4_ = uVar37;
      auVar67._24_4_ = uVar37;
      auVar67._28_4_ = uVar37;
      auVar31 = vpermps_avx2(auVar45,ZEXT1632(auVar19));
      auVar32 = vpermps_avx2(auVar62,ZEXT1632(auVar19));
      auVar72._4_4_ = fVar63;
      auVar72._0_4_ = fVar63;
      auVar72._8_4_ = fVar63;
      auVar72._12_4_ = fVar63;
      auVar72._16_4_ = fVar63;
      auVar72._20_4_ = fVar63;
      auVar72._24_4_ = fVar63;
      auVar72._28_4_ = fVar63;
      auVar29 = vpermps_avx2(auVar45,ZEXT1632(auVar20));
      auVar30 = vpermps_avx2(auVar62,ZEXT1632(auVar20));
      uVar37 = auVar23._0_4_;
      auVar74._4_4_ = uVar37;
      auVar74._0_4_ = uVar37;
      auVar74._8_4_ = uVar37;
      auVar74._12_4_ = uVar37;
      auVar74._16_4_ = uVar37;
      auVar74._20_4_ = uVar37;
      auVar74._24_4_ = uVar37;
      auVar74._28_4_ = uVar37;
      auVar28 = vpermps_avx2(auVar45,ZEXT1632(auVar23));
      auVar12 = vpermps_avx2(auVar62,ZEXT1632(auVar23));
      auVar36 = *(undefined1 (*) [32])ray;
      auVar45 = *(undefined1 (*) [32])(ray + 0x20);
      auVar62 = *(undefined1 (*) [32])(ray + 0x40);
      auVar2 = *(undefined1 (*) [32])(ray + 0x80);
      auVar3 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar4 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar23 = vfmadd231ps_fma(auVar74,auVar62,auVar72);
      auVar24 = vfmadd231ps_fma(auVar28,auVar62,auVar29);
      auVar19 = vfmadd231ps_fma(auVar12,auVar62,auVar30);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar45,auVar67);
      auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar45,auVar31);
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar45,auVar32);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar36,auVar54);
      auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar36,auVar10);
      *(undefined1 (*) [32])ray = ZEXT1632(auVar23);
      auVar23 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar36,auVar11);
      *(undefined1 (*) [32])(ray + 0x20) = ZEXT1632(auVar24);
      *(undefined1 (*) [32])(ray + 0x40) = ZEXT1632(auVar23);
      auVar28 = vmulps_avx512vl(auVar4,auVar72);
      auVar29 = vmulps_avx512vl(auVar4,auVar29);
      auVar30 = vmulps_avx512vl(auVar4,auVar30);
      auVar28 = vfmadd231ps_avx512vl(auVar28,auVar3,auVar67);
      auVar31 = vfmadd231ps_avx512vl(auVar29,auVar3,auVar31);
      auVar32 = vfmadd231ps_avx512vl(auVar30,auVar3,auVar32);
      auVar23 = vfmadd231ps_fma(auVar28,auVar2,auVar54);
      auVar24 = vfmadd231ps_fma(auVar31,auVar2,auVar10);
      auVar19 = vfmadd231ps_fma(auVar32,auVar2,auVar11);
      *(undefined1 (*) [32])(ray + 0x80) = ZEXT1632(auVar23);
      *(undefined1 (*) [32])(ray + 0xa0) = ZEXT1632(auVar24);
      *(undefined1 (*) [32])(ray + 0xc0) = ZEXT1632(auVar19);
      local_40 = vpmovm2d_avx512vl((ulong)bVar17);
      (**(code **)(p_Var16 + 0xe0))(local_40,p_Var16 + 0x58,ray);
      local_c0 = auVar36._0_8_;
      uStack_b8 = auVar36._8_8_;
      uStack_b0 = auVar36._16_8_;
      uStack_a8 = auVar36._24_8_;
      *(undefined8 *)ray = local_c0;
      *(undefined8 *)(ray + 8) = uStack_b8;
      *(undefined8 *)(ray + 0x10) = uStack_b0;
      *(undefined8 *)(ray + 0x18) = uStack_a8;
      local_a0 = auVar45._0_8_;
      uStack_98 = auVar45._8_8_;
      uStack_90 = auVar45._16_8_;
      uStack_88 = auVar45._24_8_;
      *(undefined8 *)(ray + 0x20) = local_a0;
      *(undefined8 *)(ray + 0x28) = uStack_98;
      *(undefined8 *)(ray + 0x30) = uStack_90;
      *(undefined8 *)(ray + 0x38) = uStack_88;
      local_80 = auVar62._0_8_;
      uStack_78 = auVar62._8_8_;
      uStack_70 = auVar62._16_8_;
      uStack_68 = auVar62._24_8_;
      *(undefined8 *)(ray + 0x40) = local_80;
      *(undefined8 *)(ray + 0x48) = uStack_78;
      *(undefined8 *)(ray + 0x50) = uStack_70;
      *(undefined8 *)(ray + 0x58) = uStack_68;
      local_120 = auVar2._0_8_;
      uStack_118 = auVar2._8_8_;
      uStack_110 = auVar2._16_8_;
      uStack_108 = auVar2._24_8_;
      *(undefined8 *)(ray + 0x80) = local_120;
      *(undefined8 *)(ray + 0x88) = uStack_118;
      *(undefined8 *)(ray + 0x90) = uStack_110;
      *(undefined8 *)(ray + 0x98) = uStack_108;
      local_100 = auVar3._0_8_;
      uStack_f8 = auVar3._8_8_;
      uStack_f0 = auVar3._16_8_;
      uStack_e8 = auVar3._24_8_;
      *(undefined8 *)(ray + 0xa0) = local_100;
      *(undefined8 *)(ray + 0xa8) = uStack_f8;
      *(undefined8 *)(ray + 0xb0) = uStack_f0;
      *(undefined8 *)(ray + 0xb8) = uStack_e8;
      local_e0 = auVar4._0_8_;
      uStack_d8 = auVar4._8_8_;
      uStack_d0 = auVar4._16_8_;
      uStack_c8 = auVar4._24_8_;
      *(undefined8 *)(ray + 0xc0) = local_e0;
      *(undefined8 *)(ray + 200) = uStack_d8;
      *(undefined8 *)(ray + 0xd0) = uStack_d0;
      *(undefined8 *)(ray + 0xd8) = uStack_c8;
      pRVar7->instID[0] = 0xffffffff;
      pRVar7->instPrimID[0] = 0xffffffff;
    }
  }
  return;
}

Assistant:

void InstanceArrayIntersectorK<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        const AffineSpace3vf<K> world2local = instance->getWorld2Local(prim.primID_);
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }